

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O0

qtmsg * construct_qtlist(long hdr_offset)

{
  int local_1c;
  qtmsg *pqStack_18;
  int n_msgs;
  qtmsg *msg_list;
  long hdr_offset_local;
  
  msg_list = (qtmsg *)hdr_offset;
  dlb_fseek(msg_file,hdr_offset,0);
  Fread(&local_1c,4,1,msg_file);
  pqStack_18 = (qtmsg *)malloc((ulong)(local_1c + 1) * 0x18);
  Fread(pqStack_18,local_1c * 0x18,1,msg_file);
  pqStack_18[local_1c].msgnum = -1;
  return pqStack_18;
}

Assistant:

static struct qtmsg *construct_qtlist(long hdr_offset)
{
	struct qtmsg *msg_list;
	int	n_msgs;

	dlb_fseek(msg_file, hdr_offset, SEEK_SET);
	Fread(&n_msgs, sizeof(int), 1, msg_file);
	msg_list = malloc((unsigned)(n_msgs+1)*sizeof(struct qtmsg));

	/*
	 * Load up the list.
	 */
	Fread(msg_list, n_msgs*sizeof(struct qtmsg), 1, msg_file);

	msg_list[n_msgs].msgnum = -1;
	return msg_list;
}